

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

Value * __thiscall
ot::commissioner::Interpreter::ProcessReenroll
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  ErrorCode EVar1;
  pointer pbVar2;
  Value *pVVar3;
  char *begin;
  char *pcVar4;
  string *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  CommissionerAppPtr commissioner;
  string local_138;
  Error local_118;
  undefined1 local_f0 [40];
  Value local_c8;
  undefined1 local_80 [40];
  format_string_checker<char> local_58;
  
  (__return_storage_ptr__->mError).mCode = kNone;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  commissioner.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  commissioner.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  JobManager::GetSelectedCommissioner
            ((Error *)local_f0,
             (this->mJobManager).
             super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &commissioner);
  Value::Value(&local_c8,(Error *)local_f0);
  pVVar3 = Value::operator=(__return_storage_ptr__,&local_c8);
  EVar1 = (pVVar3->mError).mCode;
  Value::~Value(&local_c8);
  std::__cxx11::string::~string((string *)(local_f0 + 8));
  if (EVar1 == kNone) {
    pbVar2 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(aExpr->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x21) {
      local_58.types_[0] = none_type;
      local_58.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "too few arguments";
      local_58.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x11;
      local_58.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_58.context_.super_basic_format_parse_context<char>._20_4_ = 0;
      local_58.parse_funcs_[0] = (parse_func)0x0;
      pcVar4 = "too few arguments";
      local_58.context_.types_ = local_58.types_;
      while (begin = pcVar4, begin != "") {
        pcVar4 = begin + 1;
        if (*begin == '}') {
          if ((pcVar4 == "") || (*pcVar4 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar4 = begin + 2;
        }
        else if (*begin == '{') {
          pcVar4 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (begin,"",&local_58);
        }
      }
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)&local_58;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_138,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args);
      local_80._0_4_ = kInvalidArgs;
      std::__cxx11::string::string((string *)(local_80 + 8),(string *)&local_138);
      Value::Value(&local_c8,(Error *)local_80);
      Value::operator=(__return_storage_ptr__,&local_c8);
      Value::~Value(&local_c8);
      std::__cxx11::string::~string((string *)(local_80 + 8));
      this_00 = &local_138;
    }
    else {
      (*((commissioner.
          super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ->super_CommissionerHandler)._vptr_CommissionerHandler[0x3e])
                (&local_118,
                 commissioner.
                 super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,pbVar2 + 1);
      Value::Value(&local_c8,&local_118);
      Value::operator=(__return_storage_ptr__,&local_c8);
      Value::~Value(&local_c8);
      this_00 = &local_118.mMessage;
    }
    std::__cxx11::string::~string((string *)this_00);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&commissioner.
              super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessReenroll(const Expression &aExpr)
{
    Value              value;
    CommissionerAppPtr commissioner = nullptr;

    SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));
    VerifyOrExit(aExpr.size() >= 2, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
    SuccessOrExit(value = commissioner->Reenroll(aExpr[1]));
exit:
    return value;
}